

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execTst<(moira::Instr)127,(moira::Mode)8,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int rg;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  bVar1 = readOp<(moira::Mode)8,(moira::Size)4,0ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)in_RDI);
  if (bVar1) {
    bVar1 = NBIT<(moira::Size)4>((ulong)in_stack_ffffffffffffffe8);
    (in_RDI->reg).sr.n = bVar1;
    bVar1 = ZERO<(moira::Size)4>((ulong)in_stack_ffffffffffffffe8);
    (in_RDI->reg).sr.z = bVar1;
    (in_RDI->reg).sr.v = false;
    (in_RDI->reg).sr.c = false;
    prefetch<4ul>(in_RDI);
  }
  return;
}

Assistant:

void
Moira::execTst(u16 opcode)
{
    int rg = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(rg, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch<POLLIPL>();
}